

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O3

void __thiscall
amrex::StateData::define
          (StateData *this,Box *p_domain,BoxArray *grds,DistributionMapping *dm,StateDescriptor *d,
          Real time,Real dt,FabFactory<amrex::FArrayBox> *factory)

{
  BoxArray *this_00;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> _Var1;
  MultiFab *pMVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  IndexType typ;
  TimeCenter TVar6;
  int ncomp;
  int ngrow;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> _Var7;
  MFInfo *info;
  MultiFab *this_01;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  BoxArray *pBVar12;
  BoxArray *pBVar13;
  double dVar14;
  Real RVar15;
  MFInfo local_58;
  undefined4 extraout_var;
  
  uVar3 = *(undefined8 *)(p_domain->smallend).vect;
  uVar4 = *(undefined8 *)((p_domain->smallend).vect + 2);
  uVar5 = *(undefined8 *)((p_domain->bigend).vect + 2);
  *(undefined8 *)(this->domain).bigend.vect = *(undefined8 *)(p_domain->bigend).vect;
  *(undefined8 *)((this->domain).bigend.vect + 2) = uVar5;
  *(undefined8 *)(this->domain).smallend.vect = uVar3;
  *(undefined8 *)((this->domain).smallend.vect + 2) = uVar4;
  this->desc = d;
  this->arena = (Arena *)0x0;
  this_00 = &this->grids;
  pBVar12 = grds;
  pBVar13 = this_00;
  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
    *(undefined8 *)&pBVar13->m_bat = *(undefined8 *)&pBVar12->m_bat;
    pBVar12 = (BoxArray *)&(pBVar12->m_bat).m_op.m_bndryReg.m_typ;
    pBVar13 = (BoxArray *)&(pBVar13->m_bat).m_op.m_bndryReg.m_typ;
  }
  (this->grids).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (grds->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->grids).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(grds->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  (this->grids).m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (grds->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->grids).m_simplified_list.
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(grds->m_simplified_list).
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->dmap).m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (dm->m_ref).
            super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->dmap).m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(dm->m_ref).
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  _Var7._M_head_impl._0_4_ = (*factory->_vptr_FabFactory[5])(factory);
  _Var7._M_head_impl._4_4_ = extraout_var;
  _Var1._M_head_impl =
       (this->m_factory)._M_t.
       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  (this->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
       _Var7._M_head_impl;
  if (_Var1._M_head_impl != (FabFactory<amrex::FArrayBox> *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_FabFactory[1])();
  }
  typ = StateDescriptor::getType(this->desc);
  TVar6 = StateDescriptor::timeType(this->desc);
  if (typ.itype != 0) {
    uVar11 = (this->domain).btype.itype;
    lVar9 = 0;
    do {
      uVar10 = 1 << ((byte)lVar9 & 0x1f);
      uVar8 = (uint)lVar9;
      (this->domain).bigend.vect[lVar9] =
           ((this->domain).bigend.vect[lVar9] + (uint)((typ.itype >> (uVar8 & 0x1f) & 1) != 0)) -
           (uint)((uVar11 >> (uVar8 & 0x1f) & 1) != 0);
      if ((typ.itype >> (uVar8 & 0x1f) & 1) == 0) {
        uVar11 = ~uVar10 & (this->domain).btype.itype;
      }
      else {
        uVar11 = uVar10 | (this->domain).btype.itype;
      }
      (this->domain).btype.itype = uVar11;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    BoxArray::convert(this_00,typ);
  }
  dVar14 = time - dt;
  RVar15 = time;
  if (TVar6 != Point) {
    RVar15 = dt + time;
    dVar14 = time;
  }
  (this->new_time).stop = RVar15;
  (this->new_time).start = time;
  (this->old_time).stop = dVar14;
  (this->old_time).start = time - dt;
  ncomp = StateDescriptor::nComp(this->desc);
  ngrow = StateDescriptor::nExtra(this->desc);
  local_58.alloc = true;
  local_58._1_7_ = 0;
  local_58.arena = (Arena *)0x0;
  local_58.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  info = MFInfo::SetTag(&local_58,"StateData");
  info->arena = this->arena;
  _Var1._M_head_impl =
       (this->m_factory)._M_t.
       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  this_01 = (MultiFab *)operator_new(0x180);
  MultiFab::MultiFab(this_01,this_00,&this->dmap,ncomp,ngrow,info,_Var1._M_head_impl);
  pMVar2 = (this->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  (this->new_data)._M_t.
  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = this_01;
  if (pMVar2 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  pMVar2 = (this->old_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  (this->old_data)._M_t.
  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
  if (pMVar2 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar2->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
  }
  return;
}

Assistant:

void
StateData::define (const Box&             p_domain,
                   const BoxArray&        grds,
                   const DistributionMapping& dm,
                   const StateDescriptor& d,
                   Real                   time,
                   Real                   dt,
                   const FabFactory<FArrayBox>& factory)
{
    BL_PROFILE("StateData::define()");
    domain = p_domain;
    desc = &d;
    arena = nullptr;
    grids = grds;
    dmap = dm;
    m_factory.reset(factory.clone());
    //
    // Convert to proper type.
    //
    IndexType typ(desc->getType());
    StateDescriptor::TimeCenter t_typ(desc->timeType());
    if (!typ.cellCentered())
    {
        domain.convert(typ);
        grids.convert(typ);
    }
    if (t_typ == StateDescriptor::Point)
    {
        new_time.start = new_time.stop = time;
        old_time.start = old_time.stop = time - dt;
    }
    else
    {
        new_time.start = time;
        new_time.stop  = time+dt;
        old_time.start = time-dt;
        old_time.stop  = time;
    }
    int ncomp = desc->nComp();

    new_data = std::make_unique<MultiFab>(grids,dmap,ncomp,desc->nExtra(),
                                          MFInfo().SetTag("StateData").SetArena(arena),
                                          *m_factory);
    old_data.reset();
}